

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O1

int __thiscall
anon_unknown.dwarf_54fb2f::NameTreeDetails::compareKeys
          (NameTreeDetails *this,QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  logic_error *this_00;
  size_type __n;
  string as;
  string bs;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60;
  string local_40;
  
  local_70 = (a->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_68 = (a->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_68->_M_use_count = local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_68->_M_use_count = local_68->_M_use_count + 1;
    }
  }
  cVar1 = (**(code **)((long)*this + 8))(this,&local_70);
  if (cVar1 == '\0') {
    cVar2 = '\0';
  }
  else {
    local_80 = (b->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    local_78 = (b->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_78->_M_use_count = local_78->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_78->_M_use_count = local_78->_M_use_count + 1;
      }
    }
    cVar2 = (**(code **)((long)*this + 8))(this,&local_80);
  }
  if ((cVar1 != '\0') && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (cVar2 != '\0') {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_60,a);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_40,b);
    __n = local_60._M_string_length;
    if (local_40._M_string_length < local_60._M_string_length) {
      __n = local_40._M_string_length;
    }
    if (__n == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = memcmp(local_60._M_dataplus._M_p,local_40._M_dataplus._M_p,__n);
      uVar4 = (ulong)uVar3;
    }
    if ((int)uVar4 == 0) {
      uVar4 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_60._M_string_length - local_40._M_string_length)) {
        uVar4 = local_60._M_string_length - local_40._M_string_length;
      }
      if (0x7ffffffe < (long)uVar4) {
        uVar4 = 0x7fffffff;
      }
    }
    if ((int)uVar4 < 0) {
      uVar3 = 0xffffffff;
    }
    else {
      if (__n == 0) {
        uVar4 = 0;
      }
      else {
        uVar3 = memcmp(local_60._M_dataplus._M_p,local_40._M_dataplus._M_p,__n);
        uVar4 = (ulong)uVar3;
      }
      if ((int)uVar4 == 0) {
        uVar4 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_60._M_string_length - local_40._M_string_length)) {
          uVar4 = local_60._M_string_length - local_40._M_string_length;
        }
        if (0x7ffffffe < (long)uVar4) {
          uVar4 = 0x7fffffff;
        }
      }
      uVar3 = (uint)(0 < (int)uVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    return uVar3;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"comparing invalid keys");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
        compareKeys(QPDFObjectHandle a, QPDFObjectHandle b) const override
        {
            if (!(keyValid(a) && keyValid(b))) {
                // We don't call this without calling keyValid first
                throw std::logic_error("comparing invalid keys");
            }
            auto as = a.getUTF8Value();
            auto bs = b.getUTF8Value();
            return ((as < bs) ? -1 : (as > bs) ? 1 : 0);
        }